

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

int on_headers_complete(http_parser *parser)

{
  int iVar1;
  cio_error cVar2;
  uint64_t *client_00;
  cio_http_server *pcVar3;
  byte local_31;
  cio_http_server *server;
  int ret;
  cio_error err;
  cio_http_client *client;
  http_parser *parser_local;
  
  client_00 = &parser[-0x1b].content_length;
  parser[-2].field_0x2 = 1;
  iVar1 = http_should_keep_alive(parser);
  *(bool *)(parser + -2) = iVar1 == 1;
  local_31 = 0;
  if ((undefined1  [32])((undefined1  [32])parser[-2] & (undefined1  [32])0x1) ==
      (undefined1  [32])0x0) {
    local_31 = (byte)parser[-2].content_length;
  }
  if ((local_31 & 1) != 0) {
    mark_to_be_closed((cio_http_client *)client_00);
  }
  parser[-0x14].content_length = parser->content_length;
  cVar2 = cio_timer_cancel((cio_timer *)&parser[-7].data);
  if (cVar2 == CIO_SUCCESS) {
    if ((((parser[-2].content_length & 1) != 0) || (*(long *)((long)parser[-0x14].data + 0x48) == 0)
        ) || (parser_local._4_4_ = (**(code **)((long)parser[-0x14].data + 0x48))(client_00),
             parser_local._4_4_ == 0)) {
      pcVar3 = cio_http_client_get_server((cio_http_client *)client_00);
      cVar2 = cio_timer_expires_from_now
                        ((cio_timer *)&parser[-7].data,pcVar3->read_body_timeout_ns,
                         client_timeout_handler,client_00);
      if (cVar2 == CIO_SUCCESS) {
        if (parser[-0x14].content_length != 0) {
          *(code **)&parser[-2].http_major = finish_bytes;
          parser[-3].data = (void *)parser[-0x14].content_length;
        }
        parser_local._4_4_ = 0;
      }
      else {
        handle_server_error((cio_http_client *)client_00,"Arming of body read timer failed!");
        parser_local._4_4_ = 0;
      }
    }
  }
  else {
    handle_server_error((cio_http_client *)client_00,
                        "Cancelling read timer in on_headers_complete failed, maybe not armed?");
    parser_local._4_4_ = 0;
  }
  return parser_local._4_4_;
}

Assistant:

static int on_headers_complete(http_parser *parser)
{
	struct cio_http_client *client = cio_container_of(parser, struct cio_http_client, parser);
	client->http_private.headers_complete = true;
	client->http_private.should_keepalive = (http_should_keep_alive(parser) == 1) ? true : false;
	if (cio_unlikely(!client->http_private.should_keepalive && client->http_private.response_fired)) {
		mark_to_be_closed(client);
	}

	if ((parser->content_length > SIZE_MAX) && (parser->content_length != ULLONG_MAX)) {
		handle_server_error(client, "Content-Length is too large to handle!");
		return 0;
	}

	client->content_length = (size_t)parser->content_length;

	enum cio_error err = cio_timer_cancel(&client->http_private.request_timer);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_server_error(client, "Cancelling read timer in on_headers_complete failed, maybe not armed?");
		return 0;
	}

	if ((!client->http_private.response_fired) && client->current_handler->on_headers_complete) {
		int ret = client->current_handler->on_headers_complete(client);
		if (cio_unlikely(ret != CIO_HTTP_CB_SUCCESS)) {
			return ret;
		}
	}

	const struct cio_http_server *server = cio_http_client_get_server(client);
	err = cio_timer_expires_from_now(&client->http_private.request_timer, server->read_body_timeout_ns, client_timeout_handler, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_server_error(client, "Arming of body read timer failed!");
		return 0;
	}

	if (client->content_length > 0) {
		client->http_private.finish_func = finish_bytes;
		client->http_private.remaining_content_length = client->content_length;
	}

	return 0;
}